

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.h
# Opt level: O0

void __thiscall IRBuilderAsmJs::IRBuilderAsmJs(IRBuilderAsmJs *this,Func *func)

{
  JitArenaAllocator *this_00;
  bool bVar1;
  JITTimeFunctionBody *pJVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_01;
  AsmJsJITInfo *pAVar3;
  TrackAllocData local_40;
  Func *local_18;
  Func *func_local;
  IRBuilderAsmJs *this_local;
  
  this->m_func = func;
  this->m_statementReader =
       (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
        *)0x0;
  this->m_jitLoopBodyData = (JitLoopBodyData *)0x0;
  local_18 = func;
  func_local = (Func *)this;
  IRBuilderAsmJsSwitchAdapter::IRBuilderAsmJsSwitchAdapter(&this->m_switchAdapter,this);
  SwitchIRBuilder::SwitchIRBuilder
            (&this->m_switchBuilder,&(this->m_switchAdapter).super_SwitchAdapter);
  pJVar2 = Func::GetJITFunctionBody(this->m_func);
  bVar1 = JITTimeFunctionBody::IsWasmFunction(pJVar2);
  if (!bVar1) {
    this_00 = local_18->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,
               (type_info *)
               &Js::
                StatementReader<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.h"
               ,0x5b);
    alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_40);
    this_01 = (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)alloc,0x3f67b0);
    memset(this_01,0,0x38);
    Js::
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::StatementReader(this_01);
    this->m_statementReader = this_01;
  }
  JITTimeWorkItem::InitializeReader
            (local_18->m_workItem,&this->m_jnReader,this->m_statementReader,
             &local_18->m_alloc->super_ArenaAllocator);
  pJVar2 = Func::GetJITFunctionBody(this->m_func);
  pAVar3 = JITTimeFunctionBody::GetAsmJsInfo(pJVar2);
  this->m_asmFuncInfo = pAVar3;
  return;
}

Assistant:

IRBuilderAsmJs(Func * func)
        : m_func(func)
        , m_switchAdapter(this)
        , m_switchBuilder(&m_switchAdapter)
    {
        if (!m_func->GetJITFunctionBody()->IsWasmFunction())
        {
            m_statementReader = Anew(func->m_alloc, Js::StatementReader<Js::FunctionBody::ArenaStatementMapList>);
        }
        func->m_workItem->InitializeReader(&m_jnReader, m_statementReader, func->m_alloc);
        m_asmFuncInfo = m_func->GetJITFunctionBody()->GetAsmJsInfo();
#if 0
        // templatized JIT loop body
        if (func->IsLoopBody())
        {
            Js::LoopEntryPointInfo* loopEntryPointInfo = (Js::LoopEntryPointInfo*)(func->m_workItem->GetEntryPoint());
            if (loopEntryPointInfo->GetIsTJMode())
            {
                m_IsTJLoopBody = true;
                func->isTJLoopBody = true;
            }
        }
#endif
    }